

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

int choose_cat_from_present<InputData<double,long>,WorkerMemory<ImputedData<long,double>,double,double>>
              (WorkerMemory<ImputedData<long,_double>,_double,_double> *workspace,
              InputData<double,_long> *input_data,size_t col_num)

{
  int *piVar1;
  pointer pcVar2;
  result_type_conflict rVar3;
  int cat;
  long lVar4;
  int iVar5;
  uniform_int_distribution<int> local_20;
  
  local_20._M_param._M_a = 0;
  local_20._M_param._M_b = (int)workspace->npresent + -1;
  rVar3 = std::uniform_int_distribution<int>::operator()(&local_20,&workspace->rnd_generator);
  workspace->ncat_tried = 0;
  piVar1 = input_data->ncat;
  pcVar2 = (workspace->categs).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 < piVar1[col_num]; lVar4 = lVar4 + 1) {
    if ('\0' < pcVar2[lVar4]) {
      if (iVar5 == rVar3) break;
      iVar5 = iVar5 + 1;
      workspace->ncat_tried = iVar5;
    }
  }
  return (int)lVar4;
}

Assistant:

int choose_cat_from_present(WorkerMemory &workspace, InputData &input_data, size_t col_num)
{
    int chosen_cat = std::uniform_int_distribution<int>
                                    (0, workspace.npresent - 1)
                                    (workspace.rnd_generator);
    workspace.ncat_tried = 0;
    for (int cat = 0; cat < input_data.ncat[col_num]; cat++)
    {
        if (workspace.categs[cat] > 0)
        {
            if (workspace.ncat_tried == chosen_cat)
                return cat;
            else
                workspace.ncat_tried++;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}